

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int average(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  memory_resource *pmVar5;
  ulong uVar6;
  char *pcVar7;
  Point2i p;
  char *__end;
  Image *im;
  pointer this;
  Float FVar8;
  atomic<bool> failed;
  string filenameBase;
  string avgFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> avgImages;
  Image avgImage;
  byte local_339;
  char **local_338;
  float local_32c;
  long local_328;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  Image *local_2c8;
  ulong local_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *local_2a0;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> local_290;
  _Any_data local_278;
  undefined1 auStack_268 [152];
  int iStack_1d0;
  uintptr_t local_1c8;
  undefined1 local_1c0 [16];
  size_t sStack_1b0;
  size_t local_1a8;
  undefined1 local_1a0 [16];
  size_t sStack_190;
  size_t local_188;
  undefined1 local_180 [16];
  size_t sStack_170;
  size_t local_168;
  undefined8 *local_158;
  undefined8 uStack_150;
  code *pcStack_148;
  code *pcStack_140;
  ImageMetadata local_138;
  
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  local_300._M_string_length = 0;
  local_300.field_2._M_local_buf[0] = '\0';
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  local_320._M_string_length = 0;
  local_320.field_2._M_local_buf[0] = '\0';
  local_338 = argv;
  if (*argv != (char *)0x0) {
    do {
      local_278._M_unused._M_object = auStack_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"outfile","");
      local_2b8._M_unused._M_object = (void *)0x0;
      local_2b8._8_8_ = 0;
      local_2a0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:574:24)>
                  ::_M_invoke;
      local_2a8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:574:24)>
                  ::_M_manager;
      bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                        (&local_338,(string *)&local_278,&local_300,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_2b8);
      if (local_2a8 != (code *)0x0) {
        (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
      }
      if ((undefined1 *)local_278._M_unused._0_8_ != auStack_268) {
        operator_delete(local_278._M_unused._M_object,
                        (ulong)((long)(_func_int ***)auStack_268._0_8_ + 1));
      }
      if (!bVar3) {
        if ((local_320._M_string_length != 0) || (pcVar7 = *local_338, *pcVar7 == '-')) {
          usage("average","%s: unknown argument",*local_338);
        }
        strlen(pcVar7);
        std::__cxx11::string::_M_replace((ulong)&local_320,0,(char *)0x0,(ulong)pcVar7);
        local_338 = local_338 + 1;
      }
    } while (*local_338 != (char *)0x0);
  }
  if (local_320._M_string_length == 0) {
    pcVar7 = "must provide base filename.";
  }
  else {
    if (local_300._M_string_length != 0) {
      pbrt::MatchingFilenames(&local_2e0,&local_320);
      if (local_2e0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_2e0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        average();
        iVar4 = 1;
      }
      else {
        iVar4 = pbrt::MaxThreadIndex();
        std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::vector
                  (&local_290,(long)iVar4,(allocator_type *)local_278._M_pod_data);
        local_339 = 0;
        local_158 = (undefined8 *)0x0;
        uStack_150 = 0;
        pcStack_148 = (code *)0x0;
        pcStack_140 = (code *)0x0;
        local_158 = (undefined8 *)operator_new(0x18);
        *local_158 = &local_2e0;
        local_158[1] = &local_290;
        local_158[2] = &local_339;
        local_278._M_unused._M_object = &local_158;
        pcStack_140 = std::
                      _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:603:38)>
                      ::_M_invoke;
        pcStack_148 = std::
                      _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:603:38)>
                      ::_M_manager;
        local_278._8_4_ = 0;
        local_278._12_4_ = 0;
        auStack_268._8_8_ =
             std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_invoke;
        auStack_268._0_8_ =
             std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_manager;
        pbrt::ParallelFor(0,(long)local_2e0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_2e0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5,
                          (function<void_(long,_long)> *)&local_278);
        if ((memory_resource *)auStack_268._0_8_ != (memory_resource *)0x0) {
          (*(code *)auStack_268._0_8_)(&local_278,&local_278,3);
        }
        if (pcStack_148 != (code *)0x0) {
          (*pcStack_148)(&local_158,&local_158,3);
        }
        iVar4 = 1;
        if ((local_339 & 1) == 0) {
          pmVar5 = pstd::pmr::new_delete_resource();
          local_278._0_4_ = 0;
          local_278._4_4_ = 0;
          local_278._8_4_ = 0;
          auStack_268._0_8_ = pstd::pmr::new_delete_resource();
          auStack_268._8_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          register0x00001200 = ZEXT816(0) << 0x40;
          local_1c8 = 0;
          local_1a8 = 0;
          local_188 = 0;
          local_168 = 0;
          local_2c8 = local_290.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          local_1c0._0_8_ = pmVar5;
          unique0x10000b45 = register0x00001200;
          local_1a0._0_8_ = pmVar5;
          unique0x10000b75 = register0x00001200;
          local_180._0_8_ = pmVar5;
          unique0x10000ba5 = register0x00001200;
          if (local_290.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_290.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this = local_290.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
            do {
              if ((this->resolution).super_Tuple2<pbrt::Point2,_int> !=
                  (Tuple2<pbrt::Point2,_int>)0x0) {
                if (CONCAT44(local_278._8_4_,local_278._4_4_) == 0) {
                  local_278._8_4_ = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
                  uVar1 = this->format;
                  uVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
                  local_278._0_4_ = uVar1;
                  local_278._4_4_ = uVar2;
                  pbrt::
                  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_268,&this->channelNames);
                  local_1c8 = (this->encoding).
                              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                              .bits;
                  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                  operator=((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>
                             *)local_1c0,&this->p8);
                  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                            ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                             local_1a0,&this->p16);
                  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_180,
                             &this->p32);
                }
                else if (0 < (int)local_278._8_4_) {
                  local_328 = 0;
                  do {
                    if (0 < (int)local_278._4_4_) {
                      local_2c0 = local_328 << 0x20;
                      uVar6 = 0;
                      do {
                        if (0 < iStack_1d0) {
                          p.super_Tuple2<pbrt::Point2,_int> =
                               (Tuple2<pbrt::Point2,_int>)(local_2c0 | uVar6);
                          iVar4 = 0;
                          do {
                            local_32c = pbrt::Image::GetChannel
                                                  (this,p,iVar4,(WrapMode2D)0x200000002);
                            if (ABS(local_32c) != INFINITY) {
                              FVar8 = pbrt::Image::GetChannel
                                                ((Image *)&local_278,p,iVar4,(WrapMode2D)0x200000002
                                                );
                              pbrt::Image::SetChannel((Image *)&local_278,p,iVar4,FVar8 + local_32c)
                              ;
                            }
                            iVar4 = iVar4 + 1;
                          } while (iVar4 < iStack_1d0);
                        }
                        uVar6 = uVar6 + 1;
                      } while ((long)uVar6 < (long)(int)local_278._4_4_);
                    }
                    local_328 = local_328 + 1;
                  } while (local_328 < (int)local_278._8_4_);
                }
              }
              this = this + 1;
            } while (this != local_2c8);
          }
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
          local_138.colorSpace.optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          local_138.colorSpace._8_8_ = 0;
          local_138.stringVectors._M_t._M_impl._0_8_ = 0;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_138.NDCFromWorld.optionalValue._52_8_ = 0;
          local_138.NDCFromWorld._60_8_ = 0;
          local_138.pixelBounds.optionalValue._0_8_ = 0;
          local_138.pixelBounds.optionalValue._8_8_ = 0;
          local_138._160_8_ = 0;
          local_138.fullResolution._4_8_ = 0;
          local_138.samplesPerPixel.optionalValue =
               (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          local_138.samplesPerPixel.set = false;
          local_138.samplesPerPixel._5_3_ = 0;
          local_138.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_138.MSE.set = false;
          local_138.MSE._5_3_ = 0;
          local_138.cameraFromWorld.optionalValue._56_8_ = 0;
          local_138._72_8_ = 0;
          local_138.NDCFromWorld.optionalValue._4_8_ = 0;
          local_138.NDCFromWorld.optionalValue._12_8_ = 0;
          local_138.NDCFromWorld.optionalValue._20_8_ = 0;
          local_138.NDCFromWorld.optionalValue._28_8_ = 0;
          local_138.NDCFromWorld.optionalValue._36_8_ = 0;
          local_138.NDCFromWorld.optionalValue._44_8_ = 0;
          local_138.renderTimeSeconds.optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_138.renderTimeSeconds.set = false;
          local_138.renderTimeSeconds._5_3_ = 0;
          local_138.cameraFromWorld.optionalValue._0_8_ = 0;
          local_138.cameraFromWorld.optionalValue._8_8_ = 0;
          local_138.cameraFromWorld.optionalValue._16_8_ = 0;
          local_138.cameraFromWorld.optionalValue._24_8_ = 0;
          local_138.cameraFromWorld.optionalValue._32_8_ = 0;
          local_138.cameraFromWorld.optionalValue._40_8_ = 0;
          local_138.cameraFromWorld.optionalValue._48_8_ = 0;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar3 = pbrt::Image::Write((Image *)&local_278,&local_300,&local_138);
          if (!bVar3) {
            pbrt::LogFatal<char_const(&)[24]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                       ,0x28a,"Check failed: %s",(char (*) [24])"avgImage.Write(avgFile)");
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&local_138.stringVectors._M_t);
          if (local_138.colorSpace.set == true) {
            local_138.colorSpace._8_8_ = local_138.colorSpace._8_8_ & 0xffffffffffffff00;
          }
          if (local_138.MSE.set == true) {
            local_138.MSE.set = false;
          }
          if (local_138.samplesPerPixel.set == true) {
            local_138.samplesPerPixel.set = false;
          }
          if (local_138.fullResolution.set == true) {
            local_138.fullResolution.set = false;
          }
          if (local_138.pixelBounds.set == true) {
            local_138._160_8_ = local_138._160_8_ & 0xffffffffffffff00;
          }
          if (local_138.NDCFromWorld.set == true) {
            local_138.NDCFromWorld.set = false;
          }
          if (local_138.cameraFromWorld.set == true) {
            local_138._72_8_ = local_138._72_8_ & 0xffffffffffffff00;
          }
          if (local_138.renderTimeSeconds.set == true) {
            local_138.renderTimeSeconds.set = false;
          }
          local_168 = 0;
          (*(*(_func_int ***)local_180._0_8_)[3])(local_180._0_8_,local_180._8_8_,sStack_170 << 2,4)
          ;
          local_188 = 0;
          (*(*(_func_int ***)local_1a0._0_8_)[3])(local_1a0._0_8_,local_1a0._8_8_,sStack_190 * 2,2);
          local_1a8 = 0;
          (*(*(_func_int ***)local_1c0._0_8_)[3])(local_1c0._0_8_,local_1c0._8_8_,sStack_1b0,1);
          pbrt::
          InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_268);
          iVar4 = 0;
        }
        std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::~vector(&local_290);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                                 local_320.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,
                                 local_300.field_2._M_local_buf[0]) + 1);
      }
      return iVar4;
    }
    pcVar7 = "must provide --outfile.";
  }
  usage("average",pcVar7);
}

Assistant:

int average(int argc, char *argv[]) {
    std::string avgFile, filenameBase;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("average", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &avgFile, onError)) {
            // success
        } else if (filenameBase.empty() && argv[0][0] != '-') {
            filenameBase = *argv;
            ++argv;
        } else
            usage("average", "%s: unknown argument", *argv);
    }

    if (filenameBase.empty())
        usage("average", "must provide base filename.");
    if (avgFile.empty())
        usage("average", "must provide --outfile.");

    std::vector<std::string> filenames = MatchingFilenames(filenameBase);
    if (filenames.empty()) {
        fprintf(stderr, "%s: no matching filenames!\n", filenameBase.c_str());
        return 1;
    }

    // Compute average image
    std::vector<Image> avgImages(MaxThreadIndex());
    std::atomic<bool> failed{false};

    ParallelFor(0, filenames.size(), [&](size_t i) {
        ImageAndMetadata imRead = Image::Read(filenames[i]);
        Image &im = imRead.image;

        Image &avg = avgImages[ThreadIndex];
        if (avg.Resolution() == Point2i(0, 0))
            avg = Image(PixelFormat::Float, im.Resolution(), im.ChannelNames());
        else if (!checkImageCompatibility(filenames[i], im, filenames[0], avg)) {
            failed = true;
            return;
        }

        for (int y = 0; y < avg.Resolution().y; ++y)
            for (int x = 0; x < avg.Resolution().x; ++x)
                for (int c = 0; c < avg.NChannels(); ++c) {
                    Float v = im.GetChannel({x, y}, c) / filenames.size();
                    if (std::isnan(v))
                        LOG_FATAL("NAN Pixel at %s in %s", Point2f(x, y), filenames[i]);
                    if (std::isinf(v))
                        v = 0;
                    avg.SetChannel({x, y}, c, avg.GetChannel({x, y}, c) + v);
                }
    });

    if (failed)
        return 1;

    // Average per-thread average images
    Image avgImage;
    for (const Image &im : avgImages) {
        if (im.Resolution() == Point2i(0, 0))
            continue;
        else if (avgImage.Resolution() == Point2i(0, 0)) {
            // First valid one
            avgImage = im;
        } else {
            for (int y = 0; y < avgImage.Resolution().y; ++y)
                for (int x = 0; x < avgImage.Resolution().x; ++x)
                    for (int c = 0; c < avgImage.NChannels(); ++c) {
                        Float v = im.GetChannel({x, y}, c);
                        if (!std::isinf(v))
                            avgImage.SetChannel({x, y}, c,
                                                avgImage.GetChannel({x, y}, c) + v);
                    }
        }
    }

    CHECK(avgImage.Write(avgFile));

    return 0;
}